

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O0

void file_size_symbol(t_file_handle *x,t_symbol *filename)

{
  int iVar1;
  uint uVar2;
  undefined1 local_a8 [8];
  stat_conflict sb;
  t_symbol *filename_local;
  t_file_handle *x_local;
  
  sb.__glibc_reserved[2] = (__syscall_slong_t)filename;
  iVar1 = do_file_stat(x,filename->s_name,(stat_conflict *)local_a8,(int *)0x0);
  if (iVar1 < 0) {
    outlet_bang(x->x_infoout);
  }
  else {
    uVar2 = (uint)sb.st_nlink & 0xf000;
    if (uVar2 == 0x4000) {
      outlet_float(x->x_dataout,0.0);
    }
    else if ((uVar2 == 0x8000) || (uVar2 == 0xa000)) {
      outlet_float(x->x_dataout,(float)(int)sb.st_rdev);
    }
    else {
      outlet_float(x->x_dataout,-1.0);
    }
  }
  return;
}

Assistant:

static void file_size_symbol(t_file_handle*x, t_symbol*filename) {
    struct stat sb;
    if(do_file_stat(x, filename->s_name, &sb, 0) < 0) {
        outlet_bang(x->x_infoout);
    } else {
        switch (sb.st_mode & S_IFMT) {
        case S_IFREG:
#ifdef S_IFLNK
        case S_IFLNK:
#endif
            outlet_float(x->x_dataout, (int)(sb.st_size));
            break;
        case S_IFDIR:
            outlet_float(x->x_dataout, 0);
            break;
        default:
            outlet_float(x->x_dataout, -1);
            break;
        }
    }
}